

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p)

{
  XMLDocument *this_00;
  bool bVar1;
  XMLAttribute *str2;
  char *pcVar2;
  XMLElement *pXVar3;
  char *in_RSI;
  long in_RDI;
  XMLAttribute *attrib;
  XMLAttribute *prevAttribute;
  char *start;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  XMLElement *attribute;
  XMLElement *this_01;
  XMLAttribute *in_stack_ffffffffffffffb0;
  MemPoolT<72> *in_stack_ffffffffffffffc0;
  XMLElement *local_28;
  char *local_18;
  
  local_28 = (XMLElement *)0x0;
  local_18 = in_RSI;
  while( true ) {
    if (local_18 == (char *)0x0) {
      return (char *)0x0;
    }
    str2 = (XMLAttribute *)XMLUtil::SkipWhiteSpace((char *)0x2598d1);
    if (*(char *)&str2->_vptr_XMLAttribute == '\0') {
      this_00 = *(XMLDocument **)(in_RDI + 8);
      pcVar2 = Name((XMLElement *)0x2598fd);
      XMLDocument::SetError(this_00,XML_ERROR_PARSING_ELEMENT,in_RSI,pcVar2);
      return (char *)0x0;
    }
    bVar1 = XMLUtil::IsNameStartChar('\0');
    if (!bVar1) {
      if (*(char *)&str2->_vptr_XMLAttribute == '>') {
        return (char *)((long)&str2->_vptr_XMLAttribute + 1);
      }
      if ((*(char *)&str2->_vptr_XMLAttribute == '/') &&
         (*(char *)((long)&str2->_vptr_XMLAttribute + 1) == '>')) {
        *(undefined4 *)(in_RDI + 0x58) = 1;
        return (char *)((long)&str2->_vptr_XMLAttribute + 2);
      }
      XMLDocument::SetError
                (*(XMLDocument **)(in_RDI + 8),XML_ERROR_PARSING_ELEMENT,in_RSI,(char *)str2);
      return (char *)0x0;
    }
    pXVar3 = (XMLElement *)MemPoolT<72>::Alloc(in_stack_ffffffffffffffc0);
    XMLAttribute::XMLAttribute(in_stack_ffffffffffffffb0);
    (pXVar3->super_XMLNode)._prev = (XMLNode *)(*(long *)(in_RDI + 8) + 0x100);
    attribute = pXVar3;
    (*((pXVar3->super_XMLNode)._prev)->_vptr_XMLNode[5])();
    this_01 = pXVar3;
    XMLDocument::ProcessEntities(*(XMLDocument **)(in_RDI + 8));
    local_18 = XMLAttribute::ParseDeep
                         ((XMLAttribute *)this_01,(char *)attribute,(bool)in_stack_ffffffffffffff9f)
    ;
    if (local_18 == (char *)0x0) break;
    XMLAttribute::Name((XMLAttribute *)0x2599da);
    pcVar2 = Attribute(this_01,(char *)attribute,
                       (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    if (pcVar2 != (char *)0x0) break;
    in_stack_ffffffffffffffb0 = str2;
    if (local_28 == (XMLElement *)0x0) {
      *(XMLElement **)(in_RDI + 0x60) = pXVar3;
      local_28 = pXVar3;
    }
    else {
      (local_28->super_XMLNode)._lastChild = &pXVar3->super_XMLNode;
      local_28 = pXVar3;
    }
  }
  DeleteAttribute((XMLAttribute *)attribute);
  XMLDocument::SetError(*(XMLDocument **)(in_RDI + 8),XML_ERROR_PARSING_ATTRIBUTE,in_RSI,local_18);
  return (char *)0x0;
}

Assistant:

char* XMLElement::ParseAttributes( char* p )
{
    const char* start = p;
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, Name() );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
            XMLAttribute* attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
            attrib->_memPool = &_document->_attributePool;
			attrib->_memPool->SetTracked();

            p = attrib->ParseDeep( p, _document->ProcessEntities() );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, start, p );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                prevAttribute->_next = attrib;
            }
            else {
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, p );
            return 0;
        }
    }
    return p;
}